

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O2

void __thiscall
highs::RbTree<HighsNodeQueue::NodeLowerRbTree>::deleteFixup
          (RbTree<HighsNodeQueue::NodeLowerRbTree> *this,LinkType x,LinkType nilParent)

{
  ulong *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long *plVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  LinkType x_00;
  
  while (x != *this->rootNode) {
    lVar4 = this[2].rootNode[1];
    x_00 = nilParent;
    if (x != -1) {
      uVar9 = *(ulong *)(lVar4 + 0x70 + x * 0x90);
      if ((long)uVar9 < 0) goto LAB_002d4b71;
      x_00 = uVar9 - 1;
    }
    lVar10 = x_00 * 0x90;
    lVar2 = *(long *)(lVar4 + 0x60 + lVar10);
    uVar9 = (ulong)(x == lVar2);
    lVar6 = *(long *)(lVar4 + lVar10 + 0x60 + uVar9 * 8);
    if (lVar6 == -1) {
      lVar6 = -1;
    }
    else {
      uVar8 = *(ulong *)(lVar4 + 0x70 + lVar6 * 0x90);
      if ((long)uVar8 < 0) {
        *(ulong *)(lVar4 + lVar6 * 0x90 + 0x70) = uVar8 & 0x7fffffffffffffff;
        puVar1 = (ulong *)(lVar4 + 0x70 + lVar10);
        *puVar1 = *puVar1 | 0x8000000000000000;
        rotate(this,x_00,(uint)(x != lVar2));
        lVar4 = this[2].rootNode[1];
        lVar6 = *(long *)(lVar4 + lVar10 + 0x60 + uVar9 * 8);
      }
    }
    lVar5 = lVar6 * 0x90;
    plVar7 = (long *)(lVar4 + lVar5 + 0x60);
    if (((*plVar7 == -1) || (-1 < *(long *)(lVar4 + 0x70 + *plVar7 * 0x90))) &&
       ((lVar3 = *(long *)(lVar4 + lVar5 + 0x68), lVar3 == -1 ||
        (-1 < *(long *)(lVar4 + 0x70 + lVar3 * 0x90))))) {
      puVar1 = (ulong *)(lVar4 + 0x70 + lVar5);
      *puVar1 = *puVar1 | 0x8000000000000000;
      x = x_00;
    }
    else {
      if ((plVar7[uVar9] == -1) || (-1 < *(long *)(lVar4 + 0x70 + plVar7[uVar9] * 0x90))) {
        uVar8 = (ulong)(x != lVar2);
        puVar1 = (ulong *)(lVar4 + 0x70 + plVar7[uVar8] * 0x90);
        *puVar1 = *puVar1 & 0x7fffffffffffffff;
        puVar1 = (ulong *)(lVar4 + 0x70 + lVar5);
        *puVar1 = *puVar1 | 0x8000000000000000;
        rotate(this,lVar6,(uint)(x == lVar2));
        lVar4 = this[2].rootNode[1];
        lVar6 = *(long *)(lVar4 + lVar10 + 0x60 + uVar9 * 8);
      }
      else {
        uVar8 = (ulong)(x != lVar2);
      }
      lVar6 = lVar6 * 0x90;
      *(ulong *)(lVar4 + 0x70 + lVar6) =
           *(ulong *)(lVar4 + 0x70 + lVar10) & 0x8000000000000000 |
           *(ulong *)(lVar4 + 0x70 + lVar6) & 0x7fffffffffffffff;
      puVar1 = (ulong *)(lVar4 + 0x70 + lVar10);
      *puVar1 = *puVar1 & 0x7fffffffffffffff;
      puVar1 = (ulong *)(lVar4 + 0x70 + *(long *)(lVar6 + lVar4 + 0x60 + uVar9 * 8) * 0x90);
      *puVar1 = *puVar1 & 0x7fffffffffffffff;
      rotate(this,x_00,(Dir)uVar8);
      x = *this->rootNode;
    }
  }
  if (x != -1) {
    lVar4 = this[2].rootNode[1];
    uVar9 = *(ulong *)(lVar4 + 0x70 + x * 0x90);
LAB_002d4b71:
    *(ulong *)(lVar4 + 0x70 + x * 0x90) = uVar9 & 0x7fffffffffffffff;
  }
  return;
}

Assistant:

void deleteFixup(LinkType x, const LinkType nilParent) {
    while (x != rootNode && isBlack(x)) {
      Dir dir;

      LinkType p = x == kNoLink ? nilParent : getParent(x);
      dir = Dir(x == getChild(p, kLeft));
      LinkType w = getChild(p, dir);
      assert(w != kNoLink);

      if (isRed(w)) {
        makeBlack(w);
        makeRed(p);
        rotate(p, opposite(dir));
        assert((x == kNoLink && p == nilParent) ||
               (x != kNoLink && p == getParent(x)));
        w = getChild(p, dir);
        assert(w != kNoLink);
      }

      if (isBlack(getChild(w, kLeft)) && isBlack(getChild(w, kRight))) {
        makeRed(w);
        x = p;
      } else {
        if (isBlack(getChild(w, dir))) {
          makeBlack(getChild(w, opposite(dir)));
          makeRed(w);
          rotate(w, dir);
          assert((x == kNoLink && p == nilParent) ||
                 (x != kNoLink && p == getParent(x)));
          w = getChild(p, dir);
        }
        setColor(w, getColor(p));
        makeBlack(p);
        makeBlack(getChild(w, dir));
        rotate(p, opposite(dir));
        x = rootNode;
      }
    }

    if (x != kNoLink) makeBlack(x);
  }